

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

char * cmsys::regbranch(int *flagp)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  byte *p;
  byte bVar7;
  char *__s;
  byte *p_00;
  char *ret;
  byte *pbVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  uint local_3c;
  
  *flagp = 0;
  pbVar2 = regcode;
  if (regcode == &regdummy) {
    regsize = regsize + 3;
  }
  else {
    regcode[0] = 6;
    regcode[1] = 0;
    regcode[2] = 0;
    regcode = regcode + 3;
  }
  p_00 = (byte *)0x0;
  pbVar10 = regparse;
  do {
    p = regcode;
    bVar7 = *pbVar10;
    if (((bVar7 == 0) || (bVar7 == 0x29)) || (bVar7 == 0x7c)) {
      if (p_00 == (byte *)0x0) {
        if (regcode == &regdummy) {
          regsize = regsize + 3;
        }
        else {
          regcode[0] = 9;
          regcode[1] = 0;
          regcode[2] = 0;
          regcode = regcode + 3;
        }
      }
      return (char *)pbVar2;
    }
    pbVar8 = pbVar10 + 1;
    regparse = pbVar8;
    if (0x5a < bVar7) {
      if (bVar7 == 0x5b) {
        if (*pbVar8 == 0x5e) {
          if (regcode == &regdummy) {
            regsize = regsize + 3;
            pbVar11 = &regdummy;
          }
          else {
            regcode[0] = 5;
            regcode[1] = 0;
            pbVar11 = regcode + 3;
            regcode[2] = 0;
            regcode = pbVar11;
          }
          pbVar8 = pbVar10 + 2;
          regparse = pbVar8;
        }
        else if (regcode == &regdummy) {
          regsize = regsize + 3;
          pbVar11 = &regdummy;
          p = &regdummy;
        }
        else {
          regcode[0] = 4;
          regcode[1] = 0;
          pbVar11 = regcode + 3;
          regcode[2] = 0;
          regcode = pbVar11;
        }
        bVar7 = *pbVar8;
        if ((bVar7 == 0x5d) || (pbVar10 = pbVar11, lVar9 = regsize, bVar7 == 0x2d)) {
          pbVar8 = pbVar8 + 1;
          regparse = pbVar8;
          if (pbVar11 == &regdummy) {
            regsize = regsize + 1;
            pbVar10 = &regdummy;
            lVar9 = regsize;
          }
          else {
            pbVar10 = pbVar11 + 1;
            regcode = pbVar10;
            *pbVar11 = bVar7;
            lVar9 = regsize;
          }
        }
        while( true ) {
          while (bVar7 = *pbVar8, bVar7 == 0x2d) {
            regparse = pbVar8 + 1;
            bVar7 = pbVar8[1];
            if ((bVar7 == 0x5d) || (bVar7 == 0)) {
              bVar7 = 0x2d;
              if (pbVar10 != &regdummy) goto LAB_0046de8d;
              regsize = lVar9 + 1;
              pbVar10 = &regdummy;
              pbVar8 = regparse;
              lVar9 = regsize;
            }
            else {
              bVar1 = pbVar8[-1];
              uVar6 = (uint)bVar1;
              if (bVar7 < bVar1) {
                __s = "RegularExpression::compile(): Invalid range in [].";
                goto LAB_0046e4c5;
              }
              pbVar11 = pbVar10;
              if (bVar1 < bVar7) {
                do {
                  if (pbVar11 == &regdummy) {
                    lVar9 = lVar9 + 1;
                    pbVar11 = &regdummy;
                    regsize = lVar9;
                  }
                  else {
                    pbVar10 = pbVar11 + 1;
                    regcode = pbVar10;
                    *pbVar11 = (char)uVar6 + 1;
                    pbVar11 = pbVar10;
                  }
                  uVar6 = uVar6 + 1;
                } while (bVar7 != uVar6);
              }
              pbVar8 = pbVar8 + 2;
              regparse = pbVar8;
            }
          }
          if ((bVar7 == 0) || (bVar7 == 0x5d)) break;
          regparse = pbVar8 + 1;
          if (pbVar10 == &regdummy) {
            regsize = lVar9 + 1;
            pbVar10 = &regdummy;
            pbVar8 = regparse;
            lVar9 = regsize;
          }
          else {
LAB_0046de8d:
            regparse = pbVar8 + 1;
            regcode = pbVar10 + 1;
            *pbVar10 = bVar7;
            pbVar10 = pbVar10 + 1;
            pbVar8 = pbVar8 + 1;
          }
        }
        if (regcode == &regdummy) {
          regsize = regsize + 1;
        }
        else {
          pbVar10 = regcode + 1;
          *regcode = 0;
          regcode = pbVar10;
        }
        if (*pbVar8 != 0x5d) {
          __s = "RegularExpression::compile(): Unmatched [].";
          goto LAB_0046e4c5;
        }
        regparse = pbVar8 + 1;
      }
      else {
        if (bVar7 != 0x5c) {
          if (bVar7 == 0x5e) {
            if (regcode != &regdummy) {
              regcode[0] = 1;
              regcode[1] = 0;
              goto LAB_0046db3a;
            }
            goto LAB_0046dc49;
          }
          goto switchD_0046daef_caseD_25;
        }
        if (*pbVar8 == 0) {
          __s = "RegularExpression::compile(): Trailing backslash.";
          goto LAB_0046e4c5;
        }
        if (regcode == &regdummy) {
          regsize = regsize + 3;
LAB_0046ddc3:
          regparse = pbVar10 + 2;
          regsize = regsize + 1;
        }
        else {
          regcode[0] = 8;
          regcode[1] = 0;
          regcode[2] = 0;
          regparse = pbVar10 + 2;
          if (regcode == (byte *)((long)&regsize + 5)) {
            regcode = &regdummy;
            goto LAB_0046ddc3;
          }
          pbVar10 = regcode + 4;
          pbVar11 = regcode + 3;
          regcode = pbVar10;
          *pbVar11 = *pbVar8;
          if (pbVar10 != &regdummy) {
            regcode = p + 5;
            p[4] = 0;
            goto LAB_0046df51;
          }
        }
        regsize = regsize + 1;
      }
LAB_0046df51:
      uVar6 = 3;
      goto LAB_0046df56;
    }
    switch(bVar7) {
    case 0x24:
      if (regcode != &regdummy) {
        regcode[0] = 2;
        regcode[1] = 0;
LAB_0046db3a:
        regcode[2] = 0;
        uVar6 = 0;
        regcode = regcode + 3;
        goto LAB_0046df56;
      }
LAB_0046dc49:
      uVar6 = 0;
      break;
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x29:
    case 0x2c:
    case 0x2d:
      goto switchD_0046daef_caseD_25;
    case 0x28:
      p = (byte *)reg(1,(int *)&local_3c);
      if (p == (byte *)0x0) {
        return (char *)0x0;
      }
      uVar6 = local_3c & 5;
      goto LAB_0046df5f;
    case 0x2a:
    case 0x2b:
switchD_0046daef_caseD_2a:
      __s = "RegularExpression::compile(): ?+* follows nothing.";
      goto LAB_0046e4c5;
    case 0x2e:
      if (regcode != &regdummy) {
        regcode[0] = 3;
        regcode[1] = 0;
        regcode[2] = 0;
        regcode = regcode + 3;
        goto LAB_0046df51;
      }
      uVar6 = 3;
      break;
    default:
      if (bVar7 == 0x3f) goto switchD_0046daef_caseD_2a;
switchD_0046daef_caseD_25:
      regparse = pbVar10;
      sVar5 = strcspn((char *)pbVar10,"^$.[()|?+*\\");
      p = regcode;
      uVar4 = (uint)sVar5;
      if ((int)uVar4 < 1) {
        __s = "RegularExpression::compile(): Internal error.";
        goto LAB_0046e4c5;
      }
      if (uVar4 == 1) {
        uVar6 = 3;
        uVar4 = 1;
      }
      else {
        uVar6 = 1;
        if (((ulong)pbVar10[uVar4 & 0x7fffffff] < 0x40) &&
           ((0x80000c0000000000U >> ((ulong)pbVar10[uVar4 & 0x7fffffff] & 0x3f) & 1) != 0)) {
          uVar4 = uVar4 - 1;
          uVar6 = (uint)(uVar4 == 1) * 2 + 1;
        }
      }
      if (regcode == &regdummy) {
        regsize = regsize + 3;
        pbVar8 = &regdummy;
      }
      else {
        regcode[0] = 8;
        regcode[1] = 0;
        pbVar8 = regcode + 3;
        regcode[2] = 0;
        regcode = pbVar8;
      }
      iVar3 = uVar4 + 1;
      lVar9 = regsize;
      pbVar11 = pbVar8;
      do {
        if (pbVar11 == &regdummy) {
          lVar9 = lVar9 + 1;
          pbVar11 = &regdummy;
          regsize = lVar9;
        }
        else {
          pbVar8 = pbVar11 + 1;
          regcode = pbVar8;
          *pbVar11 = *pbVar10;
          pbVar11 = pbVar8;
        }
        pbVar10 = pbVar10 + 1;
        iVar3 = iVar3 + -1;
      } while (1 < iVar3);
      regparse = pbVar10;
      if (pbVar8 == &regdummy) {
        regsize = lVar9 + 1;
      }
      else {
        regcode = pbVar8 + 1;
        *pbVar8 = 0;
      }
LAB_0046df56:
      if (p == (byte *)0x0) {
        return (char *)0x0;
      }
      goto LAB_0046df5f;
    }
    regsize = regsize + 3;
    p = &regdummy;
LAB_0046df5f:
    pbVar10 = regcode;
    bVar7 = *regparse;
    if (((ulong)bVar7 < 0x40) && ((0x80000c0000000000U >> ((ulong)bVar7 & 0x3f) & 1) != 0)) {
      if (bVar7 != 0x3f && (uVar6 & 1) == 0) {
        __s = "RegularExpression::compile() : *+ operand could be empty.";
        goto LAB_0046e4c5;
      }
      if (bVar7 == 0x2a) {
        if ((uVar6 & 2) == 0) {
          if (regcode == &regdummy) {
            regsize = regsize + 3;
LAB_0046e207:
            regsize = regsize + 3;
            pbVar10 = &regdummy;
            pbVar11 = &regdummy;
          }
          else {
            pbVar8 = regcode + 3;
            for (; regcode = pbVar8, p < pbVar10; pbVar10 = pbVar10 + -1) {
              pbVar10[2] = pbVar10[-1];
              pbVar8 = regcode;
            }
            p[0] = 6;
            p[1] = 0;
            p[2] = 0;
            if (regcode == &regdummy) goto LAB_0046e207;
            regcode[0] = 7;
            regcode[1] = 0;
            pbVar11 = regcode + 3;
            regcode[2] = 0;
            pbVar10 = regcode;
            regcode = pbVar11;
          }
          if ((p != &regdummy) && (*p == 6)) {
            regtail((char *)(p + 3),(char *)pbVar10);
            if (*p == 6) {
              regtail((char *)(p + 3),(char *)p);
            }
          }
          pbVar10 = p;
          lVar9 = regsize;
          if (pbVar11 == &regdummy) goto LAB_0046e2ec;
          pbVar11[0] = 6;
          pbVar11[1] = 0;
          pbVar8 = pbVar11 + 3;
          pbVar11[2] = 0;
          regcode = pbVar8;
          regtail((char *)p,(char *)pbVar11);
          if (pbVar8 == &regdummy) goto LAB_0046e2f4;
          pbVar11[3] = 9;
          pbVar11[4] = 0;
          pbVar11[5] = 0;
          regcode = pbVar11 + 6;
          goto LAB_0046e302;
        }
        if (regcode == &regdummy) {
LAB_0046e1e6:
          regsize = regsize + 3;
        }
        else {
          pbVar8 = regcode + 3;
          for (; regcode = pbVar8, p < pbVar10; pbVar10 = pbVar10 + -1) {
            pbVar10[2] = pbVar10[-1];
            pbVar8 = regcode;
          }
          p[0] = 10;
          p[1] = 0;
LAB_0046e1dd:
          p[2] = 0;
        }
      }
      else {
        if (bVar7 != 0x2b) {
          if (bVar7 != 0x3f) goto LAB_0046e322;
          if (regcode == &regdummy) {
            lVar9 = regsize + 3;
LAB_0046e3ac:
            regtail((char *)p,&regdummy);
            regsize = lVar9 + 3;
LAB_0046e3bb:
            regsize = regsize + 3;
            pbVar8 = &regdummy;
          }
          else {
            pbVar8 = regcode + 3;
            for (; regcode = pbVar8, p < pbVar10; pbVar10 = pbVar10 + -1) {
              pbVar10[2] = pbVar10[-1];
              pbVar8 = regcode;
            }
            p[0] = 6;
            p[1] = 0;
            p[2] = 0;
            pbVar10 = regcode;
            lVar9 = regsize;
            if (regcode == &regdummy) goto LAB_0046e3ac;
            pbVar10[0] = 6;
            pbVar10[1] = 0;
            pbVar8 = regcode + 3;
            regcode[2] = 0;
            regcode = pbVar8;
            regtail((char *)p,(char *)pbVar10);
            if (pbVar8 == &regdummy) goto LAB_0046e3bb;
            pbVar10[3] = 9;
            pbVar10[4] = 0;
            pbVar10[5] = 0;
            regcode = pbVar10 + 6;
          }
          regtail((char *)p,(char *)pbVar8);
          if ((p != &regdummy) && (*p == 6)) {
            regtail((char *)(p + 3),(char *)pbVar8);
          }
          goto LAB_0046e322;
        }
        if ((uVar6 & 2) != 0) {
          if (regcode == &regdummy) goto LAB_0046e1e6;
          pbVar8 = regcode + 3;
          for (; regcode = pbVar8, p < pbVar10; pbVar10 = pbVar10 + -1) {
            pbVar10[2] = pbVar10[-1];
            pbVar8 = regcode;
          }
          p[0] = 0xb;
          p[1] = 0;
          goto LAB_0046e1dd;
        }
        if (regcode != &regdummy) {
          pbVar10[0] = 6;
          pbVar10[1] = 0;
          pbVar8 = regcode + 3;
          regcode[2] = 0;
          regcode = pbVar8;
          regtail((char *)p,(char *)pbVar10);
          lVar9 = regsize;
          if (pbVar8 == &regdummy) goto LAB_0046e2e1;
          pbVar10[3] = 7;
          pbVar10[4] = 0;
          pbVar11 = pbVar10 + 6;
          pbVar10[5] = 0;
          regcode = pbVar11;
          regtail((char *)pbVar8,(char *)p);
          lVar9 = regsize;
          if (pbVar11 == &regdummy) goto LAB_0046e2ec;
          pbVar10[6] = 6;
          pbVar10[7] = 0;
          pbVar8 = pbVar10 + 9;
          pbVar10[8] = 0;
          regcode = pbVar8;
          regtail((char *)pbVar10,(char *)pbVar11);
          if (pbVar8 == &regdummy) goto LAB_0046e2f4;
          pbVar10[9] = 9;
          pbVar10[10] = 0;
          pbVar10[0xb] = 0;
          regcode = pbVar10 + 0xc;
          goto LAB_0046e302;
        }
        lVar9 = regsize + 3;
        regsize = lVar9;
        regtail((char *)p,&regdummy);
LAB_0046e2e1:
        lVar9 = lVar9 + 3;
LAB_0046e2ec:
        regtail((char *)pbVar10,&regdummy);
        regsize = lVar9 + 3;
LAB_0046e2f4:
        regsize = regsize + 3;
        pbVar8 = &regdummy;
LAB_0046e302:
        regtail((char *)p,(char *)pbVar8);
      }
LAB_0046e322:
      uVar6 = (uint)(bVar7 != 0x2b) * 3 + 1;
      pbVar10 = regparse + 1;
      pbVar8 = regparse + 1;
      regparse = pbVar10;
      if (((ulong)*pbVar8 < 0x40) && ((0x80000c0000000000U >> ((ulong)*pbVar8 & 0x3f) & 1) != 0)) {
        __s = "RegularExpression::compile(): Nested *?+.";
LAB_0046e4c5:
        puts(__s);
        return (char *)0x0;
      }
    }
    pbVar10 = regparse;
    if (p == (byte *)0x0) {
      return (char *)0x0;
    }
    uVar4 = uVar6 & 1 | *flagp;
    *flagp = uVar4;
    if (p_00 == (byte *)0x0) {
      *flagp = uVar4 | uVar6 & 0xfffffffc;
      p_00 = p;
    }
    else {
      regtail((char *)p_00,(char *)p);
      p_00 = p;
      pbVar10 = regparse;
    }
  } while( true );
}

Assistant:

static char* regbranch(int* flagp)
{
  char* ret;
  char* chain;
  char* latest;
  int flags;

  *flagp = WORST; // Tentatively.

  ret = regnode(BRANCH);
  chain = 0;
  while (*regparse != '\0' && *regparse != '|' && *regparse != ')') {
    latest = regpiece(&flags);
    if (latest == 0)
      return (0);
    *flagp |= flags & HASWIDTH;
    if (chain == 0) // First piece.
      *flagp |= flags & SPSTART;
    else
      regtail(chain, latest);
    chain = latest;
  }
  if (chain == 0) // Loop ran zero times.
    regnode(NOTHING);

  return (ret);
}